

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarHelpers.h
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
tools::xar::split<char>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,xar *this,char *delim,string_view s,ssize_t nsplits)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_type __n;
  char *__s;
  char *local_40;
  char *local_38;
  
  __s = (char *)s._M_len;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    if ((-1 < (long)s._M_str) &&
       (s._M_str <=
        (char *)((long)(__return_storage_ptr__->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(__return_storage_ptr__->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5))) {
      local_40 = delim + (long)__s;
      local_38 = __s;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*,char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_38,&local_40);
      return __return_storage_ptr__;
    }
    if (delim == (char *)0x0) {
      pcVar4 = (char *)0xffffffffffffffff;
    }
    else {
      pvVar2 = memchr(__s,(int)(char)*this,(size_t)delim);
      pcVar4 = (char *)(-(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)__s);
    }
    if (pcVar4 == (char *)0xffffffffffffffff) {
      local_40 = __s + (long)delim;
      local_38 = __s;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*,char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_38,&local_40);
    }
    else {
      local_40 = __s + (long)pcVar4;
      local_38 = __s;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*,char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_38,&local_40);
      pcVar1 = pcVar4 + 1;
      if (delim <= pcVar4) {
        uVar3 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",pcVar1,delim);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(__return_storage_ptr__);
        _Unwind_Resume(uVar3);
      }
      delim = delim + -(long)pcVar1;
      __s = __s + (long)pcVar1;
    }
  } while (pcVar4 != (char *)0xffffffffffffffff);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>
split(const DelimType& delim, std::string_view s, const ssize_t nsplits = -1) {
  std::vector<std::string> ret;

  while (true) {
    if (nsplits > -1 && ret.size() >= nsplits) {
      ret.emplace_back(s.begin(), s.end());
      break;
    }

    auto next = s.find(delim);
    if (next == std::string::npos) {
      ret.emplace_back(s.begin(), s.end());
      break;
    }

    ret.emplace_back(s.begin(), s.begin() + next);
    s = s.substr(next + delimSize(delim));
  }

  return ret;
}